

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vox2obj.cpp
# Opt level: O3

void write_tga_24bit(uint8_t *pixels,uint32_t width,uint32_t height,FILE *fout)

{
  uint uVar1;
  uint uVar2;
  tga_image_header image_header;
  tga_file_header file_header;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined8 local_38;
  undefined4 local_30;
  
  local_30 = 0;
  local_38 = 0x20000;
  local_3e = (undefined2)width;
  local_3c = (undefined2)height;
  local_3a = 0x18;
  fwrite(&local_38,0xc,1,(FILE *)fout);
  fwrite(&local_3e,6,1,(FILE *)fout);
  uVar1 = width * height * 3;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      fputc((int)(char)pixels[uVar2 + 2],(FILE *)fout);
      fputc((int)(char)pixels[uVar2 + 1],(FILE *)fout);
      fputc((int)(char)pixels[uVar2],(FILE *)fout);
      uVar2 = uVar2 + 3;
    } while (uVar2 < uVar1);
  }
  return;
}

Assistant:

void write_tga_24bit(const uint8_t* pixels, uint32_t width, uint32_t height, FILE* fout) {
    #pragma pack(push, 1)
    #pragma pack(1)
    struct tga_file_header {
        uint8_t  id_length;
        uint8_t  color_map_type;
        uint8_t  image_type;
        uint16_t first_entry_index;
        uint16_t color_map_length;
        uint8_t  color_map_entry_size;
        uint16_t origin_x;
        uint16_t origin_y;
    };
    struct tga_image_header {
        uint16_t image_width;
        uint16_t image_height;
        uint8_t  pixel_depth;
        uint8_t  pixel_descriptor;
    };
    #pragma pack(pop)
    tga_file_header  file_header = {0, 0, 2, 0, 0, 0, 0, 0 };
    tga_image_header image_header = { (uint16_t)width, (uint16_t)height, 24, 0 };
    fwrite(&file_header, sizeof(file_header), 1, fout);
    fwrite(&image_header, sizeof(image_header), 1, fout);
    // input is R,G,B, but we write in B,G,R order. This is a super slow implementation
    // that writes a byte at a time to the file, but whatever...
    uint32_t image_size = width * height * 3;
    for (uint32_t i = 0; i < image_size; i += 3) {
        fwrite(&pixels[i+2], 1, 1, fout);
        fwrite(&pixels[i+1], 1, 1, fout);
        fwrite(&pixels[i+0], 1, 1, fout);
    }
}